

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O0

void __thiscall
r_exec::AutoFocusController::notify(AutoFocusController *this,_Fact *target,View *input,TPXMap *map)

{
  bool bVar1;
  pointer pvVar2;
  TPX *pTVar3;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
  local_58 [3];
  P<r_exec::_Fact> local_40;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_38
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_30
  ;
  const_iterator m;
  TPXMap *map_local;
  View *input_local;
  _Fact *target_local;
  AutoFocusController *this_local;
  
  m.super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>.
  _M_cur = (_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
            )(_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
              )map;
  core::P<r_exec::_Fact>::P(&local_40,target);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
       ::find(map,&local_40);
  std::__detail::
  _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_30,
             (_Node_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_38);
  core::P<r_exec::_Fact>::~P(&local_40);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
       ::end(m.
             super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
             ._M_cur);
  bVar1 = std::__detail::operator!=(&local_30,local_58);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
                           *)&local_30);
    pTVar3 = core::P<r_exec::TPX>::operator->(&pvVar2->second);
    (*(pTVar3->super__Object)._vptr__Object[3])(pTVar3,input);
    std::
    unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
    ::erase((unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
             *)m.
               super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
               ._M_cur,(const_iterator)local_30._M_cur);
  }
  return;
}

Assistant:

inline void AutoFocusController::notify(_Fact *target, View *input, TPXMap &map)
{
    TPXMap::const_iterator m = map.find(target);

    if (m != map.end()) { // shall always be the case.
        m->second->signal(input); // will spawn a ReductionJob holding a P<> on m->second.
        map.erase(m);
    }
}